

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O0

cupdlp_dcs * cupdlp_dcs_transpose(cupdlp_dcs *A,int values)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *p_00;
  int *piVar5;
  cupdlp_dcs *w_00;
  int *c;
  int in_ESI;
  long in_RDI;
  cupdlp_dcs *C;
  double *Ax;
  double *Cx;
  cupdlp_int *w;
  cupdlp_int *Ai;
  cupdlp_int *Ap;
  cupdlp_int m;
  cupdlp_int n;
  cupdlp_int *Ci;
  cupdlp_int *Cp;
  cupdlp_int j;
  cupdlp_int q;
  cupdlp_int p;
  int ok;
  undefined4 uVar6;
  uint3 in_stack_ffffffffffffff94;
  uint uVar7;
  cupdlp_dcs *C_00;
  undefined8 in_stack_ffffffffffffffa8;
  double *pdVar8;
  undefined8 in_stack_ffffffffffffffb0;
  long lVar9;
  int local_20;
  int local_18;
  cupdlp_dcs *local_8;
  
  if ((in_RDI == 0) || (*(int *)(in_RDI + 0x28) != -1)) {
    local_8 = (cupdlp_dcs *)0x0;
  }
  else {
    iVar1 = *(int *)(in_RDI + 4);
    iVar2 = *(int *)(in_RDI + 8);
    lVar4 = *(long *)(in_RDI + 0x10);
    lVar9 = *(long *)(in_RDI + 0x18);
    C_00 = *(cupdlp_dcs **)(in_RDI + 0x20);
    uVar6 = *(undefined4 *)(lVar4 + (long)iVar2 * 4);
    uVar7 = (uint)in_stack_ffffffffffffff94;
    if (in_ESI != 0) {
      uVar7 = CONCAT13(C_00 != (cupdlp_dcs *)0x0,in_stack_ffffffffffffff94);
    }
    ok = iVar1;
    w_00 = cupdlp_dcs_spalloc((int)((ulong)lVar9 >> 0x20),(int)lVar9,
                              (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                              (int)in_stack_ffffffffffffffb0,
                              (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    c = (int *)calloc((long)iVar1,4);
    if ((w_00 == (cupdlp_dcs *)0x0) || (c == (int *)0x0)) {
      local_8 = cupdlp_dcs_done(C_00,w_00,(void *)CONCAT44(uVar7,uVar6),ok);
    }
    else {
      p_00 = w_00->p;
      piVar5 = w_00->i;
      pdVar8 = w_00->x;
      for (local_18 = 0; local_18 < *(int *)(lVar4 + (long)iVar2 * 4); local_18 = local_18 + 1) {
        iVar3 = *(int *)(lVar9 + (long)local_18 * 4);
        c[iVar3] = c[iVar3] + 1;
      }
      cupdlp_dcs_cumsum(p_00,c,iVar1);
      for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
        for (local_18 = *(int *)(lVar4 + (long)local_20 * 4);
            local_18 < *(int *)(lVar4 + (long)(local_20 + 1) * 4); local_18 = local_18 + 1) {
          iVar1 = *(int *)(lVar9 + (long)local_18 * 4);
          iVar3 = c[iVar1];
          c[iVar1] = iVar3 + 1;
          piVar5[iVar3] = local_20;
          if (pdVar8 != (double *)0x0) {
            pdVar8[iVar3] = *(double *)(&C_00->nzmax + (long)local_18 * 2);
          }
        }
      }
      local_8 = cupdlp_dcs_done(C_00,w_00,(void *)CONCAT44(uVar7,uVar6),ok);
    }
  }
  return local_8;
}

Assistant:

cupdlp_dcs *cupdlp_dcs_transpose(const cupdlp_dcs *A, int values) {
  cupdlp_int p, q, j, *Cp, *Ci, n, m, *Ap, *Ai, *w;
  double *Cx, *Ax;
  cupdlp_dcs *C;
  if (!IS_CSC(A)) return (NULL); /* check inputs */
  m = A->m;
  n = A->n;
  Ap = A->p;
  Ai = A->i;
  Ax = A->x;
  C = cupdlp_dcs_spalloc(n, m, Ap[n], values && Ax, 0);  /* allocate result */
  w = cupdlp_calloc(m, sizeof(cupdlp_int));              /* get workspace */
  if (!C || !w) return (cupdlp_dcs_done(C, w, NULL, 0)); /* out of memory */
  Cp = C->p;
  Ci = C->i;
  Cx = C->x;
  for (p = 0; p < Ap[n]; p++) w[Ai[p]]++; /* row counts */
  cupdlp_dcs_cumsum(Cp, w, m);            /* row pointers */
  for (j = 0; j < n; j++) {
    for (p = Ap[j]; p < Ap[j + 1]; p++) {
      Ci[q = w[Ai[p]]++] = j; /* place A(i,j) as entry C(j,i) */
      if (Cx) Cx[q] = Ax[p];
    }
  }
  return (cupdlp_dcs_done(C, w, NULL, 1)); /* success; free w and return C */
}